

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

Result<void> * init::SetLoggingCategories(ArgsManager *args)

{
  string_view str;
  string_view str_00;
  byte bVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  Logger *this;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  string *cat_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  iterator __end1;
  iterator __begin1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  categories;
  bilingual_str *in_stack_fffffffffffffd08;
  Result<void> *in_stack_fffffffffffffd10;
  Logger *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd28;
  ArgsManager *in_stack_fffffffffffffd30;
  __node_base_ptr *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  Logger *in_stack_fffffffffffffd50;
  ConstevalStringLiteral in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd78;
  ArgsManager *fmt;
  int local_234;
  allocator<char> local_1b9 [25];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  allocator<char> local_189;
  undefined1 local_188 [96];
  Logger local_128;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  bVar1 = ArgsManager::IsArgSet(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(&in_stack_fffffffffffffd08->original);
  std::allocator<char>::~allocator((allocator<char> *)(local_188 + 0x1f));
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    ArgsManager::GetArgs(in_RDI,(string *)CONCAT17(bVar1,in_stack_fffffffffffffd78));
    std::__cxx11::string::~string(&in_stack_fffffffffffffd08->original);
    std::allocator<char>::~allocator(&local_189);
    in_stack_fffffffffffffd58.lit = local_188;
    cVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd10);
    cVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd10);
    bVar2 = std::
            none_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,init::SetLoggingCategories(ArgsManager_const&)::__0>
                      (cVar3._M_current,cVar4._M_current);
    if (bVar2) {
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffd10);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffd10);
      while (bVar2 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffd18,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffd10), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd50 = LogInstance();
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd28);
        str._M_str._0_7_ = in_stack_fffffffffffffd48;
        str._M_len = (size_t)in_stack_fffffffffffffd40;
        str._M_str._7_1_ = in_stack_fffffffffffffd4f;
        in_stack_fffffffffffffd4f = BCLog::Logger::EnableCategory(in_stack_fffffffffffffd18,str);
        if (!(bool)in_stack_fffffffffffffd4f) {
          in_stack_fffffffffffffd40 = &local_128.m_category_log_levels._M_h._M_single_bucket;
          ::_(in_stack_fffffffffffffd58);
          tinyformat::format<char[7],std::__cxx11::string>
                    ((bilingual_str *)fmt,(char (*) [7])in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffd78));
          util::Result<void>::Result
                    ((Result<void> *)in_stack_fffffffffffffd18,(Error *)in_stack_fffffffffffffd10);
          util::Error::~Error((Error *)in_stack_fffffffffffffd08);
          bilingual_str::~bilingual_str(in_stack_fffffffffffffd08);
          bVar2 = true;
          goto LAB_00dd332d;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffd08);
      }
    }
    bVar2 = false;
LAB_00dd332d:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd18);
    if (bVar2) goto LAB_00dd3635;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd58.lit,(char *)in_stack_fffffffffffffd50,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  ArgsManager::GetArgs(in_RDI,(string *)CONCAT17(bVar1,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(&in_stack_fffffffffffffd08->original);
  std::allocator<char>::~allocator(local_1b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffd10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffd10);
  while (bVar2 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd18,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd10), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffd08);
    this = LogInstance();
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    str_00._M_str._0_7_ = in_stack_fffffffffffffd48;
    str_00._M_len = (size_t)in_stack_fffffffffffffd40;
    str_00._M_str._7_1_ = in_stack_fffffffffffffd4f;
    bVar2 = BCLog::Logger::DisableCategory(in_stack_fffffffffffffd18,str_00);
    if (!bVar2) {
      in_stack_fffffffffffffd18 = &local_128;
      ::_(in_stack_fffffffffffffd58);
      tinyformat::format<char[14],std::__cxx11::string>
                ((bilingual_str *)fmt,(char (*) [14])in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd78));
      util::Result<void>::Result
                ((Result<void> *)in_stack_fffffffffffffd18,(Error *)in_stack_fffffffffffffd10);
      util::Error::~Error((Error *)in_stack_fffffffffffffd08);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffd08);
      local_234 = 1;
      goto LAB_00dd35ff;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd08);
  }
  local_234 = 4;
LAB_00dd35ff:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd18);
  if (local_234 != 1) {
    util::Result<void>::Result(in_stack_fffffffffffffd10);
  }
LAB_00dd3635:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Result<void> *)fmt;
}

Assistant:

util::Result<void> SetLoggingCategories(const ArgsManager& args)
{
    if (args.IsArgSet("-debug")) {
        // Special-case: if -debug=0/-nodebug is set, turn off debugging messages
        const std::vector<std::string> categories = args.GetArgs("-debug");

        if (std::none_of(categories.begin(), categories.end(),
            [](std::string cat){return cat == "0" || cat == "none";})) {
            for (const auto& cat : categories) {
                if (!LogInstance().EnableCategory(cat)) {
                    return util::Error{strprintf(_("Unsupported logging category %s=%s."), "-debug", cat)};
                }
            }
        }
    }

    // Now remove the logging categories which were explicitly excluded
    for (const std::string& cat : args.GetArgs("-debugexclude")) {
        if (!LogInstance().DisableCategory(cat)) {
            return util::Error{strprintf(_("Unsupported logging category %s=%s."), "-debugexclude", cat)};
        }
    }
    return {};
}